

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

cf_bool_t cf_event_wait(cf_event_t *self,int timeout_ms)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  bool bVar2;
  timespec ts;
  timespec local_40;
  
  local_40.tv_sec = (__time_t)(timeout_ms / 1000);
  local_40.tv_nsec = (long)timeout_ms * 1000000;
  __mutex = &self->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  bVar2 = true;
  if (self->event_status == 0) {
    do {
      if (timeout_ms == -1) {
        iVar1 = pthread_cond_wait((pthread_cond_t *)&self->cond,(pthread_mutex_t *)__mutex);
      }
      else {
        iVar1 = pthread_cond_timedwait
                          ((pthread_cond_t *)&self->cond,(pthread_mutex_t *)__mutex,&local_40);
      }
      bVar2 = iVar1 == 0;
    } while (iVar1 == 0 && self->event_status == 0);
  }
  if ((bVar2 != false) && (self->manual_reset == 0)) {
    self->event_status = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return (cf_bool_t)bVar2;
}

Assistant:

cf_bool_t cf_event_wait(cf_event_t* self, int timeout_ms) {
#if defined(CF_OS_WIN)
    DWORD ms = timeout_ms == -1 ? INFINITE : timeout_ms;
    return (WaitForSingleObject(self->handle, ms) == WAIT_OBJECT_0);
#else
    int error = 0;
    struct timespec ts;
    ts.tv_sec = timeout_ms / 1000;
    ts.tv_nsec = CF_TYPE_CAST(cf_uint64_t, timeout_ms) * 1000000;
    pthread_mutex_lock(&self->mutex);
    while (!self->event_status && error == 0) { 
        if (timeout_ms == -1) {
            error = pthread_cond_wait(&self->cond, &self->mutex);
        } else {
            error = pthread_cond_timedwait(&self->cond, &self->mutex, &ts);
        }
    }
    if (error == 0 && !self->manual_reset) {
        self->event_status = CF_FALSE;
    }
    pthread_mutex_unlock(&self->mutex);
    return (error == 0);
#endif
}